

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dmatrix.h
# Opt level: O0

DMatrix<double> * gmath::transpose<double>(DMatrix<double> *a)

{
  int iVar1;
  double *pdVar2;
  DMatrix<double> *in_RSI;
  DMatrix<double> *in_RDI;
  double dVar3;
  int i;
  int k;
  DMatrix<double> *ret;
  undefined8 in_stack_ffffffffffffffa8;
  DMatrix<double> *in_stack_ffffffffffffffb0;
  undefined4 local_1c;
  undefined4 local_18;
  
  DMatrix<double>::cols(in_RSI);
  DMatrix<double>::rows(in_RSI);
  DMatrix<double>::DMatrix
            (in_stack_ffffffffffffffb0,(int)((ulong)in_stack_ffffffffffffffa8 >> 0x20),
             (int)in_stack_ffffffffffffffa8);
  for (local_18 = 0; iVar1 = DMatrix<double>::rows(in_RDI), local_18 < iVar1;
      local_18 = local_18 + 1) {
    for (local_1c = 0; iVar1 = DMatrix<double>::cols(in_RDI), local_1c < iVar1;
        local_1c = local_1c + 1) {
      dVar3 = DMatrix<double>::operator()(in_RSI,local_1c,local_18);
      pdVar2 = DMatrix<double>::operator()(in_RDI,local_18,local_1c);
      *pdVar2 = dVar3;
    }
  }
  return in_RDI;
}

Assistant:

inline DMatrix<T> transpose(const DMatrix<T> &a)
{
  DMatrix<T> ret(a.cols(), a.rows());

  for (int k=0; k<ret.rows(); k++)
    for (int i=0; i<ret.cols(); i++)
    {
      ret(k, i)=a(i, k);
    }

  return ret;
}